

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

void tagsEmptyHash(TidyDocImpl *doc,TidyTagImpl *tags)

{
  _DictHash *p_Var1;
  DictHash *pDVar2;
  uint i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0xb2; lVar3 = lVar3 + 1) {
    pDVar2 = tags->hashtab[lVar3];
    while (pDVar2 != (DictHash *)0x0) {
      p_Var1 = pDVar2->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pDVar2);
      pDVar2 = p_Var1;
    }
    tags->hashtab[lVar3] = (DictHash *)0x0;
  }
  return;
}

Assistant:

static void tagsEmptyHash( TidyDocImpl* doc, TidyTagImpl* tags )
{
    uint i;
    DictHash *prev, *next;

    for (i = 0; i < ELEMENT_HASH_SIZE; ++i)
    {
        prev = NULL;
        next = tags->hashtab[i];

        while(next)
        {
            prev = next->next;
            TidyDocFree(doc, next);
            next = prev;
        }

        tags->hashtab[i] = NULL;
    }
}